

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

bool slang::parsing::isValidDelayExpr(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if ((((kind == IntegerLiteralExpression) || (kind == ParenthesizedExpression)) ||
      (kind == RealLiteralExpression)) || (kind == TimeLiteralExpression)) {
    local_9 = true;
  }
  else {
    local_9 = slang::syntax::NameSyntax::isKind(kind);
  }
  return local_9;
}

Assistant:

static bool isValidDelayExpr(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::IntegerLiteralExpression:
        case SyntaxKind::TimeLiteralExpression:
        case SyntaxKind::RealLiteralExpression:
        case SyntaxKind::ParenthesizedExpression:
            return true;
        default:
            return NameSyntax::isKind(kind);
    }
}